

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O2

void __thiscall FSDist_COF::SanityCheck(FSDist_COF *this)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  ostream *poVar5;
  E *this_00;
  uint sfacI;
  ulong __n;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_1e0;
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  sfacI = 0;
  do {
    __n = (ulong)sfacI;
    if ((ulong)(((long)(this->_m_probs).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_m_probs).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= __n) {
      return;
    }
    uVar2 = 0;
    local_1e0 = 0.0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::at(&this->_m_probs,__n);
      if ((ulong)((long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= (ulong)uVar2) break;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::at(&this->_m_probs,__n);
      pvVar4 = std::vector<double,_std::allocator<double>_>::at(pvVar3,(ulong)uVar2);
      local_1e0 = local_1e0 + *pvVar4;
      uVar2 = uVar2 + 1;
    }
    bVar1 = Globals::EqualProbability(local_1e0,1.0);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_1a8,"Warning! - FSDist_COF::SanityCheck sfacI=");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5," does not sum to 1.0, but to ");
      poVar5 = std::ostream::_M_insert<double>(local_1e0);
      std::endl<char,std::char_traits<char>>(poVar5);
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1e0 + -1.0;
      auVar6 = vandpd_avx512vl(auVar7,auVar6);
      if (1e-09 <= auVar6._0_8_) {
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,&ss);
        __cxa_throw(this_00,&E::typeinfo,E::~E);
      }
      poVar5 = std::operator<<(local_1a8,"Renormalizing, since the difference is < 1e-9.");
      std::endl<char,std::char_traits<char>>(poVar5);
      Normalize(this,sfacI,local_1e0);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&std::cerr,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    sfacI = sfacI + 1;
  } while( true );
}

Assistant:

void FSDist_COF::SanityCheck()
{
    //cout << "Starting FSDist_COF<M>::SanityCheck()"<<endl;
    for(Index sfacI=0; sfacI < _m_probs.size(); sfacI++)
    {
        double psum = 0.0;
        for(Index valI=0; valI < _m_probs.at(sfacI).size(); valI++)
            psum += _m_probs.at(sfacI).at(valI);

        if(!Globals::EqualProbability(psum, 1.0))
        {
            stringstream ss;
            ss << "Warning! - FSDist_COF::SanityCheck sfacI="<<sfacI<<" does not sum to 1.0, but to " << psum << endl;
            if(  abs(psum - 1.0) < 1e-9  )
            {
                ss << "Renormalizing, since the difference is < 1e-9."<<endl;
		Normalize(sfacI, psum);

                cerr << ss.str();
            }
            else
                throw(E(ss));
        }
    }
}